

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void bigval_import_le(bigval *r,void *vdata,int len)

{
  int local_2c;
  int i;
  uchar *data;
  int len_local;
  void *vdata_local;
  bigval *r_local;
  
  bigval_clear(r);
  for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
    r->w[local_2c / 8] =
         (ulong)*(byte *)((long)vdata + (long)local_2c) << ((byte)(local_2c % 8 << 3) & 0x3f) |
         r->w[local_2c / 8];
  }
  return;
}

Assistant:

static void bigval_import_le(bigval *r, const void *vdata, int len)
{
    const unsigned char *data = (const unsigned char *)vdata;
    int i;
    bigval_clear(r);
    for (i = 0; i < len; i++)
        r->w[i / BIGNUM_INT_BYTES] |=
            (BignumInt)data[i] << (8 * (i % BIGNUM_INT_BYTES));
}